

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O3

void __thiscall M7Getter::~M7Getter(M7Getter *this)

{
  pointer pp_Var1;
  pointer pp_Var2;
  ulong uVar3;
  
  pp_Var2 = (this->algo_count).
            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (this->algo_count).
            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pp_Var1 != pp_Var2) {
    uVar3 = 0;
    do {
      if (pp_Var2[uVar3] != (_st_m7_algo_count_t *)0x0) {
        operator_delete(pp_Var2[uVar3]);
        (this->algo_count).
        super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = (_st_m7_algo_count_t *)0x0;
        pp_Var2 = (this->algo_count).
                  super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var1 = (this->algo_count).
                  super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pp_Var1 - (long)pp_Var2 >> 3));
  }
  if (pp_Var2 != (pointer)0x0) {
    operator_delete(pp_Var2);
    return;
  }
  return;
}

Assistant:

M7Getter::~M7Getter()
{
    for (size_t i = 0; i < algo_count.size(); i++)
    {
        if (algo_count[i] != NULL)
        {
            delete algo_count[i];
            algo_count[i] = NULL;
        }
    }
}